

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O2

void pdf_drop_xref_sections_imp
               (hd_context *ctx,pdf_document *doc,pdf_xref *xref_sections,int num_xref_sections)

{
  undefined8 *puVar1;
  void *p;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  
  uVar3 = 0;
  uVar4 = (ulong)xref_sections & 0xffffffff;
  if ((int)xref_sections < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    lVar2 = uVar3 * 0x38;
    puVar6 = *(undefined8 **)((doc->lexbuf).base.buffer + lVar2 + -0x80);
    while (puVar6 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*puVar6;
      lVar7 = 0x18;
      for (lVar5 = 0; p = (void *)puVar6[2], lVar5 < *(int *)(puVar6 + 1); lVar5 = lVar5 + 1) {
        if (*(pdf_obj **)((long)p + lVar7) != (pdf_obj *)0x0) {
          pdf_drop_obj(ctx,*(pdf_obj **)((long)p + lVar7));
          hd_drop_buffer(ctx,*(hd_buffer **)((long)p + lVar7 + -8));
        }
        lVar7 = lVar7 + 0x20;
      }
      hd_free(ctx,p);
      hd_free(ctx,puVar6);
      puVar6 = puVar1;
    }
    pdf_drop_obj(ctx,*(pdf_obj **)((doc->lexbuf).base.buffer + lVar2 + -0x70));
    pdf_drop_obj(ctx,*(pdf_obj **)((doc->lexbuf).base.buffer + lVar2 + -0x78));
    while (puVar6 = *(undefined8 **)((doc->lexbuf).base.buffer + lVar2 + -0x68),
          puVar6 != (undefined8 *)0x0) {
      *(undefined8 *)((doc->lexbuf).base.buffer + lVar2 + -0x68) = puVar6[1];
      pdf_drop_obj(ctx,(pdf_obj *)*puVar6);
      hd_free(ctx,puVar6);
    }
  }
  hd_free(ctx,doc);
  return;
}

Assistant:

static void pdf_drop_xref_sections_imp(hd_context *ctx, pdf_document *doc, pdf_xref *xref_sections, int num_xref_sections)
{
    pdf_unsaved_sig *usig;
    int x, e;

    for (x = 0; x < num_xref_sections; x++)
    {
        pdf_xref *xref = &xref_sections[x];
        pdf_xref_subsec *sub = xref->subsec;

        while (sub != NULL)
        {
            pdf_xref_subsec *next_sub = sub->next;
            for (e = 0; e < sub->len; e++)
            {
                pdf_xref_entry *entry = &sub->table[e];

                if (entry->obj)
                {
                    pdf_drop_obj(ctx, entry->obj);
                    hd_drop_buffer(ctx, entry->stm_buf);
                }
            }
            hd_free(ctx, sub->table);
            hd_free(ctx, sub);
            sub = next_sub;
        }

        pdf_drop_obj(ctx, xref->pre_repair_trailer);
        pdf_drop_obj(ctx, xref->trailer);

        while ((usig = xref->unsaved_sigs) != NULL)
        {
            xref->unsaved_sigs = usig->next;
            pdf_drop_obj(ctx, usig->field);
            hd_free(ctx, usig);
        }
    }

    hd_free(ctx, xref_sections);
}